

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O0

Vec_Ptr_t * Aig_ManSupportNodes(Aig_Man_t *p,Vec_Ptr_t *vParts)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *vSupport_00;
  Aig_Obj_t *pAVar2;
  undefined4 local_38;
  int iOut;
  int k;
  int i;
  Vec_Int_t *vSupport;
  Vec_Int_t *vPart;
  Vec_Ptr_t *vPartSupps;
  Vec_Ptr_t *vParts_local;
  Aig_Man_t *p_local;
  
  Aig_ManSetCioIds(p);
  iVar1 = Vec_PtrSize(vParts);
  p_00 = Vec_PtrAlloc(iVar1);
  for (iOut = 0; iVar1 = Vec_PtrSize(vParts), iOut < iVar1; iOut = iOut + 1) {
    p_01 = (Vec_Int_t *)Vec_PtrEntry(vParts,iOut);
    vSupport_00 = Vec_IntAlloc(100);
    Aig_ManIncrementTravId(p);
    pAVar2 = Aig_ManConst1(p);
    Aig_ObjSetTravIdCurrent(p,pAVar2);
    for (local_38 = 0; iVar1 = Vec_IntSize(p_01), local_38 < iVar1; local_38 = local_38 + 1) {
      iVar1 = Vec_IntEntry(p_01,local_38);
      pAVar2 = Aig_ManCo(p,iVar1);
      pAVar2 = Aig_ObjFanin0(pAVar2);
      Aig_ManSupportNodes_rec(p,pAVar2,vSupport_00);
    }
    Vec_PtrPush(p_00,vSupport_00);
  }
  Aig_ManCleanCioIds(p);
  return p_00;
}

Assistant:

Vec_Ptr_t * Aig_ManSupportNodes( Aig_Man_t * p, Vec_Ptr_t * vParts )
{
    Vec_Ptr_t * vPartSupps;
    Vec_Int_t * vPart, * vSupport;
    int i, k, iOut;
    Aig_ManSetCioIds( p );
    vPartSupps = Vec_PtrAlloc( Vec_PtrSize(vParts) );
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vPart, i )
    {
        vSupport = Vec_IntAlloc( 100 );
        Aig_ManIncrementTravId( p );
        Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
        Vec_IntForEachEntry( vPart, iOut, k )
            Aig_ManSupportNodes_rec( p, Aig_ObjFanin0(Aig_ManCo(p, iOut)), vSupport );
//        Vec_IntSort( vSupport, 0 );
        Vec_PtrPush( vPartSupps, vSupport );
    }
    Aig_ManCleanCioIds( p );
    return vPartSupps;
}